

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeTextureApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::copyteximage2d_neg_level
               (NegativeTestContext *ctx)

{
  allocator<char> local_31;
  string local_30;
  NegativeTestContext *local_10;
  NegativeTestContext *ctx_local;
  
  local_10 = ctx;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"GL_INVALID_VALUE is generated if level is less than 0.",&local_31)
  ;
  NegativeTestContext::beginSection(ctx,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  glu::CallLogWrapper::glCopyTexImage2D
            (&local_10->super_CallLogWrapper,0xde1,-1,0x1907,0,0,0x40,0x40,0);
  NegativeTestContext::expectError(local_10,0x501);
  glu::CallLogWrapper::glCopyTexImage2D
            (&local_10->super_CallLogWrapper,0x8515,-1,0x1907,0,0,0x10,0x10,0);
  NegativeTestContext::expectError(local_10,0x501);
  glu::CallLogWrapper::glCopyTexImage2D
            (&local_10->super_CallLogWrapper,0x8517,-1,0x1907,0,0,0x10,0x10,0);
  NegativeTestContext::expectError(local_10,0x501);
  glu::CallLogWrapper::glCopyTexImage2D
            (&local_10->super_CallLogWrapper,0x8519,-1,0x1907,0,0,0x10,0x10,0);
  NegativeTestContext::expectError(local_10,0x501);
  glu::CallLogWrapper::glCopyTexImage2D
            (&local_10->super_CallLogWrapper,0x8516,-1,0x1907,0,0,0x10,0x10,0);
  NegativeTestContext::expectError(local_10,0x501);
  glu::CallLogWrapper::glCopyTexImage2D
            (&local_10->super_CallLogWrapper,0x8518,-1,0x1907,0,0,0x10,0x10,0);
  NegativeTestContext::expectError(local_10,0x501);
  glu::CallLogWrapper::glCopyTexImage2D
            (&local_10->super_CallLogWrapper,0x851a,-1,0x1907,0,0,0x10,0x10,0);
  NegativeTestContext::expectError(local_10,0x501);
  NegativeTestContext::endSection(local_10);
  return;
}

Assistant:

void copyteximage2d_neg_level (NegativeTestContext& ctx)
{
	ctx.beginSection("GL_INVALID_VALUE is generated if level is less than 0.");
	ctx.glCopyTexImage2D(GL_TEXTURE_2D, -1, GL_RGB, 0, 0, 64, 64, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glCopyTexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_X, -1, GL_RGB, 0, 0, 16, 16, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glCopyTexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_Y, -1, GL_RGB, 0, 0, 16, 16, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glCopyTexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_Z, -1, GL_RGB, 0, 0, 16, 16, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glCopyTexImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_X, -1, GL_RGB, 0, 0, 16, 16, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glCopyTexImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_Y, -1, GL_RGB, 0, 0, 16, 16, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glCopyTexImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_Z, -1, GL_RGB, 0, 0, 16, 16, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();
}